

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenChar(Lexer *this)

{
  size_t sVar1;
  Token *this_00;
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *tok;
  Lexer *in_RSI;
  Error<pfederc::LexerErrorCode> *local_40;
  Position local_38;
  
  nextChar(in_RSI);
  if ((in_RSI->currentChar == 0x5c) &&
     (nextTokenStringEscapeCode(this), this->_vptr_Lexer != (_func_int **)0x0)) {
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
  nextChar(in_RSI);
  if (in_RSI->currentChar == 0x27) {
    nextChar(in_RSI);
    getCurrentCursor(&local_38,in_RSI);
    this_00 = (Token *)operator_new(0x30);
    Token::Token(this_00,in_RSI->currentToken,TOK_CHAR,&local_38);
    this->_vptr_Lexer = (_func_int **)this_00;
  }
  else {
    getCurrentCursor(&local_38,in_RSI);
    sVar1 = in_RSI->currentEndIndex;
    local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
    local_40->logLevel = LVL_ERROR;
    local_40->err = LEX_ERR_CHAR_INVALID_END;
    (local_40->pos).line = local_38.line;
    (local_40->pos).startIndex = sVar1;
    (local_40->pos).endIndex = sVar1;
    (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    if (local_40 != (Error<pfederc::LexerErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_40,local_40);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenChar() noexcept {
  nextChar(); //eat '
  
  if (currentChar == '\\') {
    std::unique_ptr<Token> tok = nextTokenStringEscapeCode();
    if (tok)
      return tok; // error forwarding
  }

  nextChar();
  if (currentChar != '\'')
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_CHAR_INVALID_END, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  nextChar(); // eat '

  return std::make_unique<Token>(currentToken, TokenType::TOK_CHAR, getCurrentCursor());
}